

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O3

void bench_ecmult_teardown_helper
               (bench_data *data,size_t *seckey_offset,size_t *scalar_offset,
               size_t *scalar_gen_offset,int iters)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  secp256k1_fe *rzr;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  secp256k1_gej *r;
  secp256k1_gej *psVar8;
  long lVar9;
  uint uVar10;
  secp256k1_gej sum_output;
  secp256k1_scalar s;
  secp256k1_gej tmp;
  secp256k1_scalar local_1d8;
  secp256k1_gej local_1b8;
  secp256k1_gej local_138;
  secp256k1_gej local_b0;
  
  local_1b8.infinity = 1;
  local_1b8.x.n[0] = 0;
  local_1b8.x.n[1] = 0;
  local_1b8.x.n[2] = 0;
  local_1b8.x.n[3] = 0;
  local_1b8.x.n[4] = 0;
  local_1b8.y.n[0] = 0;
  local_1b8.y.n[1] = 0;
  local_1b8.y.n[2] = 0;
  local_1b8.y.n[3] = 0;
  local_1b8.y.n[4] = 0;
  local_1b8.z.n[0] = 0;
  local_1b8.z.n[1] = 0;
  local_1b8.z.n[2] = 0;
  local_1b8.z.n[3] = 0;
  local_1b8.z.n[4] = 0;
  local_1d8.d[0] = 0;
  local_1d8.d[1] = 0;
  local_1d8.d[2] = 0;
  local_1d8.d[3] = 0;
  rzr = (secp256k1_fe *)scalar_gen_offset;
  if (0 < iters) {
    uVar6 = 0;
    do {
      secp256k1_gej_add_var(&local_1b8,&local_1b8,data->output + uVar6,rzr);
      iVar5 = (int)uVar6;
      if (scalar_gen_offset != (size_t *)0x0) {
        secp256k1_scalar_add
                  (&local_1d8,&local_1d8,
                   (secp256k1_scalar *)
                   ((long)data->scalars->d +
                   (ulong)(((int)*scalar_gen_offset + iVar5 & 0x7fffU) << 5)));
      }
      if (seckey_offset != (size_t *)0x0) {
        rzr = (secp256k1_fe *)(ulong)(((int)*seckey_offset + iVar5 & 0x7fffU) << 5);
        puVar1 = (uint64_t *)((long)rzr->n + (long)data->seckeys->d);
        local_138.x.n[0] = *puVar1;
        local_138.x.n[1] = puVar1[1];
        puVar1 = (uint64_t *)((long)(data->seckeys->d + 2) + (long)rzr);
        local_138.x.n[2] = *puVar1;
        local_138.x.n[3] = puVar1[1];
        secp256k1_scalar_mul
                  ((secp256k1_scalar *)&local_138,(secp256k1_scalar *)&local_138,
                   (secp256k1_scalar *)
                   ((long)data->scalars->d + (ulong)(((int)*scalar_offset + iVar5 & 0x7fffU) << 5)))
        ;
        secp256k1_scalar_add(&local_1d8,&local_1d8,(secp256k1_scalar *)&local_138);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)iters);
  }
  secp256k1_ecmult_gen(&data->ctx->ecmult_gen_ctx,&local_b0,&local_1d8);
  r = &local_138;
  secp256k1_gej_neg(r,&local_b0);
  psVar8 = r;
  secp256k1_gej_add_var(r,r,&local_1b8,rzr);
  iVar5 = (int)r;
  if (local_138.infinity != 0) {
    return;
  }
  bench_ecmult_teardown_helper_cold_1();
  uVar6 = (psVar8->y).n[3];
  uVar10 = (uint)((ulong)(long)iVar5 / uVar6);
  if (0 < (int)uVar10) {
    uVar3 = (psVar8->y).n[4];
    lVar9 = 0;
    uVar7 = 0;
    do {
      if ((int)(psVar8->y).n[4] == 0) {
        lVar4 = 0;
      }
      else {
        lVar4 = (psVar8->z).n[0] * 0x20 + (psVar8->x).n[2];
      }
      (*(code *)(psVar8->y).n[2])
                ((psVar8->x).n[0] + 0xb8,(psVar8->x).n[1],(psVar8->z).n[2] + lVar9,lVar4,
                 bench_ecmult_multi_callback,psVar8,(long)(int)uVar6 - (long)(int)uVar3);
      uVar2 = (psVar8->z).n[1];
      (psVar8->z).n[0] = (psVar8->z).n[0] + uVar6 & 0x7fff;
      (psVar8->z).n[1] = uVar2 + uVar6 + 0x7fff & 0x7fff;
      uVar7 = uVar7 + 1;
      lVar9 = lVar9 + 0x80;
    } while (uVar7 < (uVar10 & 0x7fffffff));
  }
  return;
}

Assistant:

static void bench_ecmult_teardown_helper(bench_data* data, size_t* seckey_offset, size_t* scalar_offset, size_t* scalar_gen_offset, int iters) {
    int i;
    secp256k1_gej sum_output, tmp;
    secp256k1_scalar sum_scalars;

    secp256k1_gej_set_infinity(&sum_output);
    secp256k1_scalar_set_int(&sum_scalars, 0);
    for (i = 0; i < iters; ++i) {
        secp256k1_gej_add_var(&sum_output, &sum_output, &data->output[i], NULL);
        if (scalar_gen_offset != NULL) {
            secp256k1_scalar_add(&sum_scalars, &sum_scalars, &data->scalars[(*scalar_gen_offset+i) % POINTS]);
        }
        if (seckey_offset != NULL) {
            secp256k1_scalar s = data->seckeys[(*seckey_offset+i) % POINTS];
            secp256k1_scalar_mul(&s, &s, &data->scalars[(*scalar_offset+i) % POINTS]);
            secp256k1_scalar_add(&sum_scalars, &sum_scalars, &s);
        }
    }
    secp256k1_ecmult_gen(&data->ctx->ecmult_gen_ctx, &tmp, &sum_scalars);
    CHECK(secp256k1_gej_eq_var(&tmp, &sum_output));
}